

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iter.c
# Opt level: O1

int main(void)

{
  byte *pbVar1;
  uint insn;
  size_t sVar2;
  uint64_t uVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  cs_err cVar6;
  cs_insn *insn_00;
  char *pcVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  csh handle;
  size_t size;
  uint8_t *code;
  uint64_t address;
  csh local_60;
  byte *local_58;
  long local_50;
  size_t local_48;
  byte *local_40;
  uint64_t local_38;
  
  lVar8 = 0;
  do {
    puts("****************");
    local_50 = lVar8;
    printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_002659e8)[lVar8 * 5]);
    cVar6 = cs_open((&DAT_002659d0)[lVar8 * 10],(&DAT_002659d4)[lVar8 * 10],&local_60);
    if (cVar6 == CS_ERR_OK) {
      if ((&DAT_002659f0)[lVar8 * 10] != 0) {
        cs_option(local_60,(&DAT_002659f0)[lVar8 * 10],(ulong)(uint)(&DAT_002659f4)[lVar8 * 10]);
      }
      cs_option(local_60,CS_OPT_DETAIL,3);
      insn_00 = cs_malloc(local_60);
      local_58 = (&PTR_anon_var_dwarf_27_002659d8)[lVar8 * 5];
      sVar2 = (&DAT_002659e0)[lVar8 * 5];
      printf("Code: ");
      if (0 < (long)sVar2) {
        pbVar1 = local_58 + sVar2;
        pbVar9 = local_58;
        do {
          printf("0x%02x ",(ulong)*pbVar9);
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 < pbVar1);
      }
      putchar(10);
      puts("Disasm:");
      local_38 = 0x1000;
      local_40 = local_58;
      local_48 = sVar2;
      _Var5 = cs_disasm_iter(local_60,&local_40,&local_48,&local_38,insn_00);
      if (_Var5) {
        do {
          uVar3 = insn_00->address;
          insn = insn_00->id;
          pcVar7 = cs_insn_name(local_60,insn);
          printf("0x%lx:\t%s\t\t%s // insn-ID: %u, insn-mnem: %s\n",uVar3,insn_00->mnemonic,
                 insn_00->op_str,(ulong)insn,pcVar7);
          pcVar4 = insn_00->detail;
          if (pcVar4->regs_read_count != '\0') {
            printf("\tImplicit registers read: ");
            if (pcVar4->regs_read_count != '\0') {
              uVar10 = 0;
              do {
                pcVar7 = cs_reg_name(local_60,(uint)pcVar4->regs_read[uVar10]);
                printf("%s ",pcVar7);
                uVar10 = uVar10 + 1;
              } while (uVar10 < pcVar4->regs_read_count);
            }
            putchar(10);
          }
          if (pcVar4->regs_write_count != '\0') {
            printf("\tImplicit registers modified: ");
            if (pcVar4->regs_write_count != '\0') {
              uVar10 = 0;
              do {
                pcVar7 = cs_reg_name(local_60,(uint)pcVar4->regs_write[uVar10]);
                printf("%s ",pcVar7);
                uVar10 = uVar10 + 1;
              } while (uVar10 < pcVar4->regs_write_count);
            }
            putchar(10);
          }
          if (pcVar4->groups_count != '\0') {
            printf("\tThis instruction belongs to groups: ");
            if (pcVar4->groups_count != '\0') {
              uVar10 = 0;
              do {
                pcVar7 = cs_group_name(local_60,(uint)pcVar4->groups[uVar10]);
                printf("%s ",pcVar7);
                uVar10 = uVar10 + 1;
              } while (uVar10 < pcVar4->groups_count);
            }
            putchar(10);
          }
          _Var5 = cs_disasm_iter(local_60,&local_40,&local_48,&local_38,insn_00);
        } while (_Var5);
      }
      putchar(10);
      cs_free(insn_00,1);
      cs_close(&local_60);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar6);
    }
    lVar8 = local_50 + 1;
  } while (lVar8 != 0x10);
  return 0;
}

Assistant:

int main()
{
	test();

	return 0;
}